

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,char *internalDependsFileName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  byte bVar1;
  bool bVar2;
  undefined8 in_RAX;
  long *plVar3;
  ostream *poVar4;
  undefined7 extraout_var;
  size_t __n;
  byte *pbVar5;
  int result;
  ostringstream msg;
  int local_1fc;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1f8;
  char *local_1f0;
  ulong local_1e8;
  undefined8 local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *local_1d8;
  char *local_1d0;
  char *local_1c8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  local_1e0 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
  local_1e8 = 0;
  local_1d8 = &validDeps->_M_t;
  local_1d0 = internalDependsFileName;
LAB_003b3ead:
  do {
    while( true ) {
      pbVar5 = (byte *)this->Dependee;
      do {
        plVar3 = (long *)std::istream::getline((char *)internalDepends,(long)pbVar5);
        if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
          return (bool)((byte)local_1e0 & 1);
        }
        pbVar5 = (byte *)this->Dependee;
        bVar1 = *pbVar5;
      } while (((ulong)bVar1 < 0x24) && ((0x800002001U >> ((ulong)bVar1 & 0x3f) & 1) != 0));
      __n = *(size_t *)(internalDepends + 8);
      if (pbVar5[__n - 2] == 0xd) {
        pbVar5[__n - 2] = 0;
        __n = __n - 1;
        pbVar5 = (byte *)this->Dependee;
        bVar1 = *pbVar5;
      }
      if (bVar1 == 0x20) break;
      memcpy(this->Depender,pbVar5,__n);
      bVar2 = cmsys::SystemTools::FileExists(this->Depender);
      local_1e8 = CONCAT71(extraout_var,bVar2);
      std::__cxx11::string::string((string *)local_1a8,this->Depender,(allocator *)local_1c8);
      local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                                *)local_1d8,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
    }
    pbVar5 = pbVar5 + 1;
    local_1f0 = this->Depender;
    if (local_1f8 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      std::__cxx11::string::string((string *)local_1a8,(char *)pbVar5,(allocator *)local_1c8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1f8,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
    }
    bVar2 = cmsys::SystemTools::FileExists((char *)pbVar5);
    if (!bVar2) {
      if (this->Verbose != true) goto LAB_003b41ca;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = std::operator<<((ostream *)local_1a8,"Dependee \"");
      poVar4 = std::operator<<(poVar4,(char *)pbVar5);
      poVar4 = std::operator<<(poVar4,"\" does not exist for depender \"");
      poVar4 = std::operator<<(poVar4,local_1f0);
      poVar4 = std::operator<<(poVar4,"\".");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout(local_1c8[0]);
      goto LAB_003b41ba;
    }
    if ((local_1e8 & 1) == 0) goto LAB_003b402d;
    local_1fc = 0;
    bVar2 = cmFileTimeComparison::FileTimeCompare
                      (this->FileComparison,local_1f0,(char *)pbVar5,&local_1fc);
  } while ((bVar2) && (-1 < local_1fc));
  if (this->Verbose == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = std::operator<<((ostream *)local_1a8,"Dependee \"");
    poVar4 = std::operator<<(poVar4,(char *)pbVar5);
    poVar4 = std::operator<<(poVar4,"\" is newer than depender \"");
    poVar4 = std::operator<<(poVar4,local_1f0);
    poVar4 = std::operator<<(poVar4,"\".");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout(local_1c8[0]);
    goto LAB_003b41ba;
  }
  goto LAB_003b41ca;
LAB_003b402d:
  local_1fc = 0;
  bVar2 = cmFileTimeComparison::FileTimeCompare
                    (this->FileComparison,local_1d0,(char *)pbVar5,&local_1fc);
  if ((!bVar2) || (local_1fc < 0)) {
    if (this->Verbose == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = std::operator<<((ostream *)local_1a8,"Dependee \"");
      poVar4 = std::operator<<(poVar4,(char *)pbVar5);
      poVar4 = std::operator<<(poVar4,"\" is newer than depends file \"");
      poVar4 = std::operator<<(poVar4,local_1d0);
      poVar4 = std::operator<<(poVar4,"\".");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout(local_1c8[0]);
LAB_003b41ba:
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
LAB_003b41ca:
    if (local_1f8 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      std::__cxx11::string::string((string *)local_1a8,this->Depender,(allocator *)local_1c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
      ::erase(local_1d8,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
    }
    local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
    local_1e0 = 0;
    if ((local_1e8 & 1) != 0) {
      std::__cxx11::string::string((string *)local_1a8,local_1f0,(allocator *)local_1c8);
      cmsys::SystemTools::RemoveFile(local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
      local_1e8 = 0;
      local_1e0 = 0;
    }
  }
  goto LAB_003b3ead;
}

Assistant:

bool cmDepends::CheckDependencies(std::istream& internalDepends,
                                  const char* internalDependsFileName,
                            std::map<std::string, DependencyVector>& validDeps)
{
  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;
  DependencyVector* currentDependencies = 0;

  while(internalDepends.getline(this->Dependee, this->MaxPath))
    {
    if ( this->Dependee[0] == 0 || this->Dependee[0] == '#' ||
         this->Dependee[0] == '\r' )
      {
      continue;
      }
    size_t len = internalDepends.gcount()-1;
    if ( this->Dependee[len-1] == '\r' )
      {
      len --;
      this->Dependee[len] = 0;
      }
    if ( this->Dependee[0] != ' ' )
      {
      memcpy(this->Depender, this->Dependee, len+1);
      // Calling FileExists() for the depender here saves in many cases 50%
      // of the calls to FileExists() further down in the loop. E.g. for
      // kdelibs/khtml this reduces the number of calls from 184k down to 92k,
      // or the time for cmake -E cmake_depends from 0.3 s down to 0.21 s.
      dependerExists = cmSystemTools::FileExists(this->Depender);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[this->Depender];
      continue;
      }
    /*
    // Parse the dependency line.
    if(!this->ParseDependency(line.c_str()))
      {
      continue;
      }
      */

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    const char* dependee = this->Dependee+1;
    const char* depender = this->Depender;
    if (currentDependencies != 0)
      {
      currentDependencies->push_back(dependee);
      }

    if(!cmSystemTools::FileExists(dependee))
      {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if(this->Verbose)
        {
        std::ostringstream msg;
        msg << "Dependee \"" << dependee
            << "\" does not exist for depender \""
            << depender << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str().c_str());
        }
      }
    else
      {
      if(dependerExists)
        {
        // The dependee and depender both exist.  Compare file times.
        int result = 0;
        if((!this->FileComparison->FileTimeCompare(depender, dependee,
                                              &result) || result < 0))
          {
          // The depender is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if(this->Verbose)
            {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depender \""
                << depender << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str().c_str());
            }
          }
        }
      else
        {
        // The dependee exists, but the depender doesn't. Regenerate if the
        // internalDepends file is older than the dependee.
        int result = 0;
        if((!this->FileComparison->FileTimeCompare(internalDependsFileName,
                                             dependee, &result) || result < 0))
          {
          // The depends-file is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if(this->Verbose)
            {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depends file \""
                << internalDependsFileName << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str().c_str());
            }
          }
        }
      }
    if(regenerate)
      {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != 0)
        {
        validDeps.erase(this->Depender);
        currentDependencies = 0;
        }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists)
        {
        cmSystemTools::RemoveFile(depender);
        dependerExists = false;
        }
      }
    }

  return okay;
}